

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::do_perform
                 (reactor_op *base)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  error_code *in_RDI;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  socket_type in_stack_00000010;
  status result;
  reactive_socket_send_op_base<asio::const_buffers_1> *o;
  const_buffer local_48;
  const_buffer local_38;
  const_buffer local_28;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  status sVar4;
  error_code *peVar5;
  int flags;
  
  peVar5 = in_RDI;
  local_28 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                       ((const_buffers_1 *)&in_RDI[4]._M_cat);
  flags = (int)((ulong)peVar5 >> 0x20);
  const_buffer::data(&local_28);
  local_38 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                       ((const_buffers_1 *)&in_RDI[4]._M_cat);
  const_buffer::size(&local_38);
  bVar2 = socket_ops::non_blocking_send1
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr,flags,in_RDI,
                     (size_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  sVar4 = (status)bVar2;
  if ((sVar4 == done) && ((in_RDI[4].field_0x4 & 0x10) != 0)) {
    uVar1 = *(ulong *)(in_RDI + 3);
    local_48 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first
                         ((const_buffers_1 *)&in_RDI[4]._M_cat);
    sVar3 = const_buffer::size(&local_48);
    if (uVar1 < sVar3) {
      sVar4 = done_and_exhausted;
    }
  }
  return sVar4;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_send1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs_type::first(o->buffers_).size())
            result = done_and_exhausted;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_send(o->socket_,
            bufs.buffers(), bufs.count(), o->flags_,
            o->ec_, o->bytes_transferred_) ? done : not_done;

      if (result == done)
        if ((o->state_ & socket_ops::stream_oriented) != 0)
          if (o->bytes_transferred_ < bufs.total_size())
            result = done_and_exhausted;
    }

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }